

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

FILE * tofile(lua_State *L)

{
  long *plVar1;
  
  plVar1 = (long *)luaL_checkudata(L,1,"FILE*");
  if (plVar1[1] == 0) {
    luaL_error(L,"attempt to use a closed file");
  }
  if ((FILE *)*plVar1 != (FILE *)0x0) {
    return (FILE *)*plVar1;
  }
  __assert_fail("p->f",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/liolib.c"
                ,0xb2,"FILE *tofile(lua_State *)");
}

Assistant:

static FILE *tofile (lua_State *L) {
  LStream *p = tolstream(L);
  if (isclosed(p))
    luaL_error(L, "attempt to use a closed file");
  lua_assert(p->f);
  return p->f;
}